

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpp_wrapper3.cpp
# Opt level: O3

planck_unit_suite_t * cpp_wrapper3_getsuite_2(void)

{
  planck_unit_suite_t *suite;
  
  suite = planck_unit_new_suite();
  planck_unit_add_to_suite
            (suite,test_cpp_wrapper_range_single_all,"test_cpp_wrapper_range_single_all",
             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test3/test_cpp_wrapper3.cpp"
            );
  planck_unit_add_to_suite
            (suite,test_cpp_wrapper_range_multiple_all,"test_cpp_wrapper_range_multiple_all",
             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test3/test_cpp_wrapper3.cpp"
            );
  planck_unit_add_to_suite
            (suite,test_cpp_wrapper_range_nonexist_empty_all,
             "test_cpp_wrapper_range_nonexist_empty_all",
             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test3/test_cpp_wrapper3.cpp"
            );
  planck_unit_add_to_suite
            (suite,test_cpp_wrapper_range_nonexist_all,"test_cpp_wrapper_range_nonexist_all",
             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test3/test_cpp_wrapper3.cpp"
            );
  planck_unit_add_to_suite
            (suite,test_cpp_wrapper_range_exist_single_all,"test_cpp_wrapper_range_exist_single_all"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test3/test_cpp_wrapper3.cpp"
            );
  planck_unit_add_to_suite
            (suite,test_cpp_wrapper_range_all_all,"test_cpp_wrapper_range_all_all",
             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test3/test_cpp_wrapper3.cpp"
            );
  return suite;
}

Assistant:

planck_unit_suite_t *
cpp_wrapper3_getsuite_2(
) {
	planck_unit_suite_t *suite = planck_unit_new_suite();

	PLANCK_UNIT_ADD_TO_SUITE(suite, test_cpp_wrapper_range_single_all);
	PLANCK_UNIT_ADD_TO_SUITE(suite, test_cpp_wrapper_range_multiple_all);
	PLANCK_UNIT_ADD_TO_SUITE(suite, test_cpp_wrapper_range_nonexist_empty_all);
	PLANCK_UNIT_ADD_TO_SUITE(suite, test_cpp_wrapper_range_nonexist_all);
	PLANCK_UNIT_ADD_TO_SUITE(suite, test_cpp_wrapper_range_exist_single_all);
	PLANCK_UNIT_ADD_TO_SUITE(suite, test_cpp_wrapper_range_all_all);

	return suite;
}